

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::TestFactoryImpl<(anonymous_namespace)::ktxTexture1WriteKTX2TestRGB8_3D_Test>::
CreateTest(TestFactoryImpl<(anonymous_namespace)::ktxTexture1WriteKTX2TestRGB8_3D_Test> *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x188);
  anon_unknown.dwarf_c382::ktxTexture1WriteKTX2TestRGB8::ktxTexture1WriteKTX2TestRGB8
            ((ktxTexture1WriteKTX2TestRGB8 *)this_00);
  (((ktxTexture1WriteKTX2TestBase<unsigned_char,_3U,_32849U> *)&this_00->_vptr_Test)->
  super_ktxTexture1WriteTestBase<unsigned_char,_3U,_32849U>).super_Test._vptr_Test =
       (_func_int **)&PTR__ktxTexture1WriteTestBase_0018d8a8;
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }